

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

bool __thiscall ipx::SparseMatrix::IsSorted(SparseMatrix *this)

{
  Int IVar1;
  char *pcVar2;
  int __c;
  int __c_00;
  SparseMatrix *in_RDI;
  Int p;
  Int j;
  Int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_18;
  int local_14;
  
  local_14 = 0;
  do {
    IVar1 = cols((SparseMatrix *)0x84d0dd);
    if (IVar1 <= local_14) {
      return true;
    }
    for (local_18 = begin((SparseMatrix *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
        IVar1 = end((SparseMatrix *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc), (int)local_18 < IVar1 + -1; local_18 = local_18 + 1)
    {
      pcVar2 = index(in_RDI,(char *)(ulong)local_18,__c);
      in_stack_ffffffffffffffd4 = (int)pcVar2;
      pcVar2 = index(in_RDI,(char *)(ulong)(local_18 + 1),__c_00);
      if ((int)pcVar2 < in_stack_ffffffffffffffd4) {
        return false;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool SparseMatrix::IsSorted() const {
    for (Int j = 0; j < cols(); j++) {
        for (Int p = begin(j); p < end(j)-1; p++)
            if (index(p) > index(p+1))
                return false;
    }
    return true;
}